

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void Json::stream(Value *jv,write_t *write)

{
  undefined8 uVar1;
  unsigned_long local_48;
  char *local_40;
  _Any_data local_38;
  code *local_28;
  
  std::function<void_(const_void_*,_unsigned_long)>::function
            ((function<void_(const_void_*,_unsigned_long)> *)&local_38,write);
  detail::write_value((write_t *)&local_38,jv);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_40 = "\n";
  local_48 = 1;
  if ((write->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*write->_M_invoker)((_Any_data *)write,&local_40,&local_48);
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

void
stream (Json::Value const& jv, write_t write)
{
    detail::write_value(write, jv);
    write("\n", 1);
}